

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O3

void update_smart_learn(monster_conflict *mon,player *p,wchar_t flag,wchar_t pflag,wchar_t element)

{
  bitflag *pbVar1;
  _Bool _Var2;
  uint32_t uVar3;
  
  if (flag != L'\0' || (uint)element < 0x19) {
    if (flag != L'\0') {
      equip_learn_flag(p,flag);
    }
    if ((uint)element < 0x19) {
      equip_learn_element(p,element);
    }
    if (((p->opts).opt[0x28] == true) && (_Var2 = monster_is_stupid((monster *)mon), !_Var2)) {
      _Var2 = monster_is_smart((monster *)mon);
      if ((!_Var2) && (uVar3 = Rand_div(2), uVar3 == 0)) {
        return;
      }
      uVar3 = Rand_div(100);
      if (uVar3 != 0) {
        if (flag != L'\0') {
          _Var2 = player_of_has(p,flag);
          pbVar1 = (mon->known_pstate).flags;
          if (_Var2) {
            flag_on_dbg(pbVar1,5,flag,"mon->known_pstate.flags","flag");
          }
          else {
            flag_off(pbVar1,5,flag);
          }
        }
        if (pflag != L'\0') {
          _Var2 = flag_has_dbg((p->state).pflags,3,pflag,"p->state.pflags","pflag");
          pbVar1 = (mon->known_pstate).pflags;
          if (_Var2) {
            flag_on_dbg(pbVar1,5,pflag,"mon->known_pstate.pflags","pflag");
          }
          else {
            flag_off(pbVar1,5,pflag);
          }
        }
        if ((uint)element < 0x19) {
          (mon->known_pstate).el_info[(uint)element].res_level =
               (p->state).el_info[(uint)element].res_level;
        }
      }
    }
  }
  return;
}

Assistant:

void update_smart_learn(struct monster *mon, struct player *p, int flag,
						int pflag, int element)
{
	bool element_ok = ((element >= 0) && (element < ELEM_MAX));

	/* Sanity check */
	if (!flag && !element_ok) return;

	/* Anything a monster might learn, the player should learn */
	if (flag) equip_learn_flag(p, flag);
	if (element_ok) equip_learn_element(p, element);

	/* Not allowed to learn */
	if (!OPT(p, birth_ai_learn)) return;

	/* Too stupid to learn anything */
	if (monster_is_stupid(mon)) return;

	/* Not intelligent, only learn sometimes */
	if (!monster_is_smart(mon) && one_in_(2)) return;

	/* Analyze the knowledge; fail very rarely */
	if (one_in_(100))
		return;

	/* Learn the flag */
	if (flag) {
		if (player_of_has(p, flag)) {
			of_on(mon->known_pstate.flags, flag);
		} else {
			of_off(mon->known_pstate.flags, flag);
		}
	}

	/* Learn the pflag */
	if (pflag) {
		if (pf_has(p->state.pflags, pflag)) {
			of_on(mon->known_pstate.pflags, pflag);
		} else {
			of_off(mon->known_pstate.pflags, pflag);
		}
	}

	/* Learn the element */
	if (element_ok)
		mon->known_pstate.el_info[element].res_level
			= p->state.el_info[element].res_level;
}